

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_filter.cpp
# Opt level: O3

uint64_t * read_data(char *filename,size_t *array_size,size_t maxline,bool printall)

{
  ulong uVar1;
  uint64_t *__ptr;
  FILE *__stream;
  ulong uVar2;
  clock_t cVar3;
  __off_t _Var4;
  undefined7 in_register_00000009;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  char *line;
  size_t line_capacity;
  byte *local_70;
  uint64_t *local_68;
  ulong *local_60;
  undefined4 local_54;
  ulong local_50;
  ulong local_48;
  size_t local_40;
  clock_t local_38;
  
  local_70 = (byte *)0x0;
  local_40 = 0;
  __ptr = (uint64_t *)malloc(0x12c000000);
  if (__ptr == (uint64_t *)0x0) {
    __ptr = (uint64_t *)0x0;
    printf("Cannot allocate memory. Use a machine with plenty of RAM.");
  }
  else {
    *array_size = 0;
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("Cannot read the input file %s.",filename);
      free(__ptr);
LAB_001026cd:
      __ptr = (uint64_t *)0x0;
    }
    else {
      local_54 = (undefined4)CONCAT71(in_register_00000009,printall);
      local_38 = clock();
      uVar2 = getline((char **)&local_70,&local_40,__stream);
      if ((int)uVar2 != -1) {
        local_50 = 0x25800000;
        do {
          if ((int)uVar2 < 0x10) {
            printf("\r%256s","");
            fflush((FILE *)0x0);
            printf("Skipping line %s since it is too short (%d)\n",local_70,uVar2 & 0xffffffff);
          }
          else {
            uVar2 = (long)digittoval[local_70[2]] << 4 | (long)digittoval[local_70[3]] |
                    (long)digittoval[local_70[1]] << 8 | (long)digittoval[*local_70] << 0xc;
            uVar6 = (int)digittoval[local_70[6]] << 4 | (int)digittoval[local_70[7]] |
                    (int)digittoval[local_70[5]] << 8 | (int)digittoval[local_70[4]] << 0xc;
            uVar5 = (int)digittoval[local_70[10]] << 4 | (int)digittoval[local_70[0xb]] |
                    (int)digittoval[local_70[9]] << 8 | (int)digittoval[local_70[8]] << 0xc;
            uVar7 = (int)digittoval[local_70[0xe]] << 4 | (int)digittoval[local_70[0xf]] |
                    (int)digittoval[local_70[0xd]] << 8 | (int)digittoval[local_70[0xc]] << 0xc;
            local_68 = __ptr;
            local_60 = array_size;
            local_48 = maxline;
            if (((uVar5 | uVar7 | uVar6 | (uint)uVar2) & 0xffff0000) == 0) {
              if (local_50 <= *array_size) {
                local_50 = (*array_size * 3 >> 1) + 0x40;
                local_68 = (uint64_t *)realloc(__ptr,local_50);
                if (local_68 == (uint64_t *)0x0) {
                  puts("Reallocation failed. Aborting.");
                  goto LAB_001026cd;
                }
              }
              uVar2 = (ulong)uVar5 << 0x10 | (ulong)uVar6 << 0x20 | uVar2 << 0x30 | (ulong)uVar7;
              if ((char)local_54 != '\0') {
                printf("hexval = 0x%lx\n",uVar2);
              }
              maxline = local_48;
              array_size = local_60;
              __ptr = local_68;
              uVar1 = *local_60;
              *local_60 = uVar1 + 1;
              local_68[uVar1] = uVar2;
              uVar2 = *local_60;
              if ((uVar2 != 0) && (uVar2 % 1000000 == 0)) {
                printf("\rread %zu hashes.");
                uVar2 = *array_size;
              }
              if (uVar2 == maxline) {
                printf("Reached the maximum number of lines %zu.\n",maxline);
                break;
              }
              fflush((FILE *)0x0);
            }
            else {
              printf("\r%256s","");
              fflush((FILE *)0x0);
              printf("Skipping line %s since it does not start with an hexadecimal\n",local_70);
              array_size = local_60;
              __ptr = local_68;
              maxline = local_48;
            }
          }
          uVar2 = getline((char **)&local_70,&local_40,__stream);
        } while ((int)uVar2 != -1);
      }
      cVar3 = clock();
      free(local_70);
      _Var4 = ftello(__stream);
      fclose(__stream);
      printf("\rI read %zu hashes in total (%.3f seconds).\n",
             (double)((float)(cVar3 - local_38) / 1e+06),*array_size);
      printf("Bytes read = %zu.\n",_Var4);
    }
  }
  return __ptr;
}

Assistant:

uint64_t *read_data(const char *filename, size_t &array_size, size_t maxline,
                    bool printall) {
  char *line = NULL;
  size_t line_capacity = 0;
  int read;

  size_t array_capacity = 600 * 1024 * 1024;
  uint64_t *array = (uint64_t *)malloc(array_capacity * sizeof(uint64_t));
  if (array == NULL) {
    printf("Cannot allocate memory. Use a machine with plenty of RAM.");
    return nullptr;
  }
  array_size = 0;

  FILE *fp = fopen(filename, "r");
  if (fp == NULL) {
    printf("Cannot read the input file %s.", filename);
    free(array);
    return nullptr;
  }
  clock_t start = clock();

  while ((read = getline(&line, &line_capacity, fp)) != -1) {
    if (read < 16) {
      printf("\r%256s", "");
      fflush(NULL);
      printf("Skipping line %s since it is too short (%d)\n", line, read);
      continue;
    }
    uint64_t x1 = hex_to_u32_nocheck((const uint8_t *)line);
    uint64_t x2 = hex_to_u32_nocheck((const uint8_t *)line + 4);
    uint64_t x3 = hex_to_u32_nocheck((const uint8_t *)line + 8);
    uint64_t x4 = hex_to_u32_nocheck((const uint8_t *)line + 12);
    if ((x1 | x2 | x3 | x4) > 0xFFFF) {
      printf("\r%256s", "");
      fflush(NULL);
      printf("Skipping line %s since it does not start with an hexadecimal\n",
             line);
      continue;
    }
    if (array_size >= array_capacity) {
      array_capacity = 3 * array_size / 2 + 64;
      uint64_t *newarray = (uint64_t *)realloc(array, array_capacity);
      if (newarray == NULL) {
        printf("Reallocation failed. Aborting.\n");
        return nullptr;
      }
      array = newarray;
    }
    uint64_t hexval = (x1 << 48) | (x2 << 32) | (x3 << 16) | x4;
    if (printall)
      printf("hexval = 0x%" PRIx64 "\n", hexval);
    array[array_size++] = hexval;
    if ((array_size > 0) && ((array_size % 1000000) == 0)) {
      printf("\rread %zu hashes.", array_size);
    }
    if (array_size == maxline) {
      printf("Reached the maximum number of lines %zu.\n", maxline);
      break;
    }
    fflush(NULL);
  }
  clock_t end = clock();
  free(line);
  size_t numberofbytes = ftello(fp);
  fclose(fp);

  printf("\rI read %zu hashes in total (%.3f seconds).\n", array_size,
         (float)(end - start) / CLOCKS_PER_SEC);
  printf("Bytes read = %zu.\n", numberofbytes);
  return array;
}